

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::Handler(Handler *this)

{
  undefined4 *in_RDI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *this_00;
  
  *in_RDI = 0x4b;
  in_RDI[1] = 0x19;
  in_RDI[2] = 0;
  in_RDI[3] = 0x4b;
  in_RDI[4] = 0x19;
  in_RDI[5] = 0;
  in_RDI[6] = 0x4b;
  in_RDI[7] = 0x19;
  in_RDI[8] = 0;
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined2 *)((long)in_RDI + 0x26) = 0;
  *(undefined2 *)(in_RDI + 10) = 0;
  *(undefined2 *)((long)in_RDI + 0x2a) = 0;
  std::vector<Server,_std::allocator<Server>_>::vector
            ((vector<Server,_std::allocator<Server>_> *)0x127d54);
  this_00 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *)(in_RDI + 0x12);
  std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::vector
            ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)0x127d67);
  std::
  vector<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
  ::vector((vector<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
            *)0x127d7a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x127d8d);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                   *)0x127da3);
  std::
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   *)0x127db9);
  std::
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   *)0x127dcf);
  std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::vector
            ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)0x127de5);
  std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::vector
            ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)0x127dfb);
  *(undefined2 *)(in_RDI + 0x19a82) = 0;
  in_RDI[0x19a83] = 0;
  *(undefined2 *)(in_RDI + 0x19a84) = 0;
  std::vector<Result,_std::allocator<Result>_>::vector
            ((vector<Result,_std::allocator<Result>_> *)0x127e2d);
  std::ofstream::ofstream(in_RDI + 0x19a8c);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(this_00);
  in_RDI[0x19b0e] = 0;
  *(undefined8 *)(in_RDI + 0x19b10) = 0;
  *(undefined8 *)(in_RDI + 0x19b12) = 0;
  return;
}

Assistant:

Handler::Handler() {
}